

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O2

void losexp(char *drainer)

{
  boolean bVar1;
  schar sVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  xchar *pxVar8;
  xchar *pxVar9;
  xchar *pxVar10;
  xchar *pxVar11;
  
  if ((drainer == (char *)0x0) || (iVar3 = strcmp(drainer,"#levelchange"), iVar3 != 0)) {
    bVar1 = resists_drli(&youmonst);
    if (bVar1 != '\0') {
      return;
    }
    if (1 < u.ulevel) goto LAB_0019663c;
    if (drainer != (char *)0x0) {
      killer_format = 1;
      killer = drainer;
      done(0);
    }
  }
  else if (1 < u.ulevel) {
LAB_0019663c:
    pcVar4 = Goodbye();
    u.ulevel = u.ulevel + -1;
    pline("%s level %d.",pcVar4);
    adjabil(u.ulevel + 1,u.ulevel);
    reset_rndmonst(-1);
    goto LAB_00196685;
  }
  u.uexp = 0;
LAB_00196685:
  iVar3 = newhp();
  u.uhpmax = u.uhpmax - iVar3;
  if (u.uhpmax < 2) {
    u.uhpmax = 1;
  }
  uVar7 = u.uhp - iVar3;
  uVar6 = 1;
  if ((uVar7 == 0 || u.uhp < iVar3) || (uVar6 = u.uhpmax, u.uhp = uVar7, (uint)u.uhpmax < uVar7)) {
    u.uhp = uVar6;
  }
  iVar3 = (int)urole.xlev;
  pxVar10 = &urace.enadv.hifix;
  if (u.ulevel < iVar3) {
    pxVar10 = &urace.enadv.lofix;
  }
  pxVar11 = &urole.enadv.hifix;
  if (u.ulevel < iVar3) {
    pxVar11 = &urole.enadv.lofix;
  }
  pxVar9 = &urace.enadv.hirnd;
  if (u.ulevel < iVar3) {
    pxVar9 = &urace.enadv.lornd;
  }
  pxVar8 = &urole.enadv.hirnd;
  if (u.ulevel < iVar3) {
    pxVar8 = &urole.enadv.lornd;
  }
  sVar2 = acurr(2);
  iVar3 = rn2((int)*pxVar9 + (int)*pxVar8 + (int)(sVar2 / '\x02'));
  iVar3 = enermod((int)*pxVar10 + (int)*pxVar11 + iVar3);
  u.uenmax = u.uenmax - iVar3;
  if (u.uenmax < 1) {
    u.uenmax = 0;
  }
  u.uen = u.uen - iVar3;
  uVar6 = 0;
  if ((u.uen < 0) || (uVar6 = u.uenmax, (uint)u.uenmax < (uint)u.uen)) {
    u.uen = uVar6;
  }
  if (0 < u.uexp) {
    lVar5 = newuexp(u.ulevel);
    u.uexp = (int)lVar5 + -1;
  }
  iflags.botl = '\x01';
  return;
}

Assistant:

void losexp(const char *drainer)		
{
	int num;

	/* override life-drain resistance when handling an explicit
	   wizard mode request to reduce level; never fatal though */
	if (drainer && !strcmp(drainer, "#levelchange"))
	    drainer = 0;
	else
	    if (resists_drli(&youmonst)) return;

	if (u.ulevel > 1) {
		pline("%s level %d.", Goodbye(), u.ulevel--);
		/* remove intrinsic abilities */
		adjabil(u.ulevel + 1, u.ulevel);
		reset_rndmonst(NON_PM);	/* new monster selection */
	} else {
		if (drainer) {
			killer_format = KILLED_BY;
			killer = drainer;
			done(DIED);
		}
		/* no drainer or lifesaved */
		u.uexp = 0;
	}
	num = newhp();
	u.uhpmax -= num;
	if (u.uhpmax < 1) u.uhpmax = 1;
	u.uhp -= num;
	if (u.uhp < 1) u.uhp = 1;
	else if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;

	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);		/* M. Stephenson */
	u.uenmax -= num;
	if (u.uenmax < 0) u.uenmax = 0;
	u.uen -= num;
	if (u.uen < 0) u.uen = 0;
	else if (u.uen > u.uenmax) u.uen = u.uenmax;

	if (u.uexp > 0)
		u.uexp = newuexp(u.ulevel) - 1;
	iflags.botl = 1;
}